

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Prerequisite.hpp
# Opt level: O0

void __thiscall Prerequisite::displayCourseInfo(Prerequisite *this)

{
  int iVar1;
  ostream *poVar2;
  void *this_00;
  string local_60 [48];
  string local_30 [32];
  Prerequisite *local_10;
  Prerequisite *this_local;
  
  local_10 = this;
  poVar2 = std::operator<<((ostream *)&std::cout,"Course Name: ");
  (*(this->super_CourseComponent).super_Observer._vptr_Observer[3])();
  poVar2 = std::operator<<(poVar2,local_30);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_30);
  poVar2 = std::operator<<((ostream *)&std::cout,"Number of Units: ");
  iVar1 = (*(this->super_CourseComponent).super_Observer._vptr_Observer[4])();
  this_00 = (void *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Course Description: ");
  (*(this->super_CourseComponent).super_Observer._vptr_Observer[7])();
  poVar2 = std::operator<<(poVar2,local_60);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

void displayCourseInfo() { 
                cout << "Course Name: " << getCourseName() << endl;
                cout << "Number of Units: " << getCourseUnits() << endl;
                cout << "Course Description: " << getCourseDescription() << endl;
            }